

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

void object_flavor_aware(player *p,object *obj)

{
  uint32_t *puVar1;
  object_kind *kind;
  _Bool _Var2;
  loc grid;
  object *poVar3;
  int y;
  store *psVar4;
  long lVar5;
  int x;
  
  poVar3 = obj->known;
  if (poVar3 == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                  ,0x938,"void object_flavor_aware(struct player *, struct object *)");
  }
  kind = obj->kind;
  if (kind->aware == false) {
    kind->aware = true;
    poVar3->effect = obj->effect;
    _Var2 = kind_is_ignored_unaware(kind);
    if (_Var2) {
      kind_ignore_when_aware(obj->kind);
    }
    puVar1 = &p->upkeep->notice;
    *puVar1 = *puVar1 | 2;
    for (poVar3 = p->gear; poVar3 != (object *)0x0; poVar3 = poVar3->next) {
      object_set_base_known(p,poVar3);
    }
    if (0 < world->num_towns) {
      lVar5 = 0;
      do {
        for (psVar4 = world->towns[lVar5].stores; psVar4 != (store *)0x0; psVar4 = psVar4->next) {
          for (poVar3 = psVar4->stock; poVar3 != (object *)0x0; poVar3 = poVar3->next) {
            object_set_base_known(p,poVar3);
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < world->num_towns);
    }
    if ((cave != (chunk_conflict *)0x0) && (1 < cave->height)) {
      y = 1;
      do {
        if (1 < cave->width) {
          x = 1;
          do {
            grid = (loc)loc(x,y);
            poVar3 = square_object(cave,grid);
            if (poVar3 != (object *)0x0) {
              do {
                if (poVar3->kind == obj->kind) {
                  square_light_spot((chunk *)cave,grid);
                  break;
                }
                poVar3 = poVar3->next;
              } while (poVar3 != (object *)0x0);
            }
            x = x + 1;
          } while (x < cave->width);
        }
        y = y + 1;
      } while (y < cave->height);
    }
  }
  return;
}

Assistant:

void object_flavor_aware(struct player *p, struct object *obj)
{
	int y, x, i;
	struct object *obj1;

	assert(obj->known);
	if (obj->kind->aware) return;
	obj->kind->aware = true;
	obj->known->effect = obj->effect;

	/* Fix ignore/autoinscribe */
	if (kind_is_ignored_unaware(obj->kind))
		kind_ignore_when_aware(obj->kind);
	p->upkeep->notice |= PN_IGNORE;

	/* Update player objects */
	for (obj1 = p->gear; obj1; obj1 = obj1->next)
		object_set_base_known(p, obj1);

	/* Store objects */
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;
		while (s) {
			for (obj1 = s->stock; obj1; obj1 = obj1->next) {
				object_set_base_known(p, obj1);
			}
			s = s->next;
		}
	}

	/* Quit if no dungeon yet */
	if (!cave) return;

	/* Some objects change tile on awareness, so update display for all
	 * floor objects of this kind */
	for (y = 1; y < cave->height; y++) {
		for (x = 1; x < cave->width; x++) {
			bool light = false;
			const struct object *floor_obj;
			struct loc grid = loc(x, y);

			for (floor_obj = square_object(cave, grid); floor_obj;
				 floor_obj = floor_obj->next)
				if (floor_obj->kind == obj->kind) {
					light = true;
					break;
				}

			if (light) square_light_spot(cave, grid);
		}
	}
}